

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json_unix.cpp
# Opt level: O0

bool xmrig::Json::save(char *fileName,Document *doc)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  CrtAllocator *in_RDI;
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  writer;
  OStreamWrapper osw;
  ofstream ofs;
  size_t in_stack_fffffffffffffd68;
  BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *os;
  undefined7 in_stack_fffffffffffffd80;
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *in_stack_fffffffffffffdc0;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffdc8;
  BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_230;
  undefined4 local_228;
  BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_> local_218 [66];
  byte local_1;
  
  _Var2 = std::operator|(_S_out,_S_bin);
  _Var2 = std::operator|(_Var2,_S_trunc);
  os = local_218;
  std::ofstream::ofstream(os,(char *)in_RDI,_Var2);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    local_1 = 0;
    local_228 = 1;
  }
  else {
    rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>::
    BasicOStreamWrapper(&local_230,(basic_ostream<char,_std::char_traits<char>_> *)local_218);
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::PrettyWriter((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                    *)CONCAT17(bVar1,in_stack_fffffffffffffd80),os,in_RDI,in_stack_fffffffffffffd68)
    ;
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::SetFormatOptions((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                        *)&stack0xfffffffffffffd88,kFormatSingleLineArray);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    Accept<rapidjson::PrettyWriter<rapidjson::BasicOStreamWrapper<std::ostream>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
              (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    local_1 = 1;
    local_228 = 1;
    rapidjson::
    PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::~PrettyWriter((PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                     *)0x23d907);
  }
  std::ofstream::~ofstream(local_218);
  return (bool)(local_1 & 1);
}

Assistant:

bool xmrig::Json::save(const char *fileName, const rapidjson::Document &doc)
{
    std::ofstream ofs(fileName, std::ios_base::out | std::ios_base::binary | std::ios_base::trunc);
    if (!ofs.is_open()) {
        return false;
    }

    rapidjson::OStreamWrapper osw(ofs);
    rapidjson::PrettyWriter<rapidjson::OStreamWrapper> writer(osw);
    writer.SetFormatOptions(rapidjson::kFormatSingleLineArray);

    doc.Accept(writer);

    return true;
}